

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O1

void __thiscall PGSStreamReader::yuvToRgb(PGSStreamReader *this,int minY)

{
  RGBQUAD RVar1;
  _Base_ptr p_Var2;
  RGBQUAD *pRVar3;
  long lVar4;
  byte *pbVar5;
  RGBQUAD *pRVar6;
  byte *pbVar7;
  _Rb_tree_header *p_Var8;
  RGBQUAD zeroRgb;
  YUVQuad yuvPal [256];
  undefined1 local_844 [4];
  undefined1 local_840;
  int local_83c;
  byte local_838 [1024];
  RGBQUAD local_438 [258];
  
  pbVar7 = this->m_imgBuffer;
  pRVar6 = (RGBQUAD *)this->m_rgbBuffer;
  lVar4 = (ulong)this->m_video_height * (ulong)this->m_video_width;
  local_83c = minY;
  memset(local_438,0,0x400);
  memset(local_838,0,0x400);
  memset(local_438,0,0x400);
  p_Var2 = (this->m_palette)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(this->m_palette)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var8) {
    do {
      local_840 = p_Var2[1].field_0x4;
      local_844 = (undefined1  [4])p_Var2[1]._M_color;
      RVar1 = text_subtitles::TextToPGSConverter::YUVAToRGBA((YUVQuad *)(local_844 + 1));
      local_438[local_844[0]] = RVar1;
      *(uint *)(local_838 + (ulong)local_844[0] * 4) = CONCAT13(local_840,local_844._1_3_);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var8);
  }
  local_844[0] = '\0';
  local_844[1] = '\0';
  local_844[2] = '\0';
  local_844[3] = '\0';
  if (lVar4 != 0) {
    pbVar5 = pbVar7 + lVar4;
    do {
      pRVar3 = local_438 + *pbVar7;
      if ((int)(uint)local_838[(ulong)*pbVar7 * 4] < local_83c) {
        pRVar3 = (RGBQUAD *)local_844;
      }
      *pRVar6 = *pRVar3;
      pRVar6 = pRVar6 + 1;
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 < pbVar5);
  }
  return;
}

Assistant:

void PGSStreamReader::yuvToRgb(const int minY) const
{
    const uint8_t* src = m_imgBuffer;
    const int size = m_video_width * m_video_height;
    const uint8_t* end = src + size;
    auto dst = reinterpret_cast<RGBQUAD*>(m_rgbBuffer);

    RGBQUAD rgbPal[256]{};
    YUVQuad yuvPal[256];
    memset(&rgbPal[0], 0, sizeof(rgbPal));
    memset(&rgbPal[0], 0, sizeof(yuvPal));

    for (auto itr : m_palette)
    {
        rgbPal[itr.first] = TextToPGSConverter::YUVAToRGBA(itr.second);
        yuvPal[itr.first] = itr.second;
    }
    constexpr RGBQUAD zeroRgb = {};
    for (; src < end; ++src)
    {
        if (yuvPal[*src].Y >= minY)
            *dst++ = rgbPal[*src];
        else
            *dst++ = zeroRgb;
    }
}